

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

shared_ptr<const_mathiu::impl::Expr> __thiscall
mathiu::impl::mergeSum<mathiu::impl::Sum>(impl *this,Sum *c1,Sum *c2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_mathiu::impl::Expr> sVar1;
  Sum result;
  Integer in_stack_ffffffffffffff9c;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_50;
  
  integer(in_stack_ffffffffffffff9c);
  merge<mathiu::impl::Sum,mathiu::impl::mergeSum<mathiu::impl::Sum>(mathiu::impl::Sum_const&,mathiu::impl::Sum_const&)::_lambda(auto:1&&,auto:2&&)_1_,std::shared_ptr<mathiu::impl::Expr_const>>
            (&local_50,(impl *)c1,c2,local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  if (local_50._M_impl.super__Rb_tree_header._M_node_count == 1) {
    std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left);
  }
  else {
    std::make_shared<mathiu::impl::Expr_const,mathiu::impl::Sum>((Sum *)this);
  }
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~_Rb_tree(&local_50);
  sVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_mathiu::impl::Expr>)
         sVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto mergeSum(C const &c1, C const &c2)
    {
        constexpr auto add = [](auto &&lhs, auto &&rhs)
        { return lhs + rhs; };
        auto result = merge(c1, c2, add, 0_i);
        ;
        if (result.size() == 1)
        {
            return (*result.begin()).second;
        }
        return makeSharedExprPtr(std::move(result));
    }